

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<Parser::IncludePath>::emplace<Parser::IncludePath>
          (QGenericArrayOps<Parser::IncludePath> *this,qsizetype i,IncludePath *args)

{
  qsizetype *pqVar1;
  IncludePath **ppIVar2;
  Data *pDVar3;
  long lVar4;
  IncludePath *pIVar5;
  Data *pDVar6;
  char *pcVar7;
  qsizetype qVar8;
  long in_FS_OFFSET;
  bool bVar9;
  Inserter local_98;
  IncludePath local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QArrayDataPointer<Parser::IncludePath>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_0011ec5d:
    local_48.path.d.d = (args->path).d.d;
    local_48.path.d.ptr = (args->path).d.ptr;
    (args->path).d.d = (Data *)0x0;
    (args->path).d.ptr = (char *)0x0;
    local_48.path.d.size = (args->path).d.size;
    (args->path).d.size = 0;
    local_48._25_7_ = 0xaaaaaaaaaaaaaa;
    local_48.isFrameworkPath = args->isFrameworkPath;
    bVar9 = (this->super_QArrayDataPointer<Parser::IncludePath>).size != 0;
    QArrayDataPointer<Parser::IncludePath>::detachAndGrow
              (&this->super_QArrayDataPointer<Parser::IncludePath>,(uint)(i == 0 && bVar9),1,
               (IncludePath **)0x0,(QArrayDataPointer<Parser::IncludePath> *)0x0);
    qVar8 = local_48.path.d.size;
    pcVar7 = local_48.path.d.ptr;
    pDVar6 = local_48.path.d.d;
    if (i == 0 && bVar9) {
      pIVar5 = (this->super_QArrayDataPointer<Parser::IncludePath>).ptr;
      local_48.path.d.d = (Data *)0x0;
      pIVar5[-1].path.d.d = pDVar6;
      local_48.path.d.ptr = (char *)0x0;
      pIVar5[-1].path.d.ptr = pcVar7;
      local_48.path.d.size = 0;
      pIVar5[-1].path.d.size = qVar8;
      pIVar5[-1].isFrameworkPath = local_48.isFrameworkPath;
      (this->super_QArrayDataPointer<Parser::IncludePath>).ptr = pIVar5 + -1;
      pqVar1 = &(this->super_QArrayDataPointer<Parser::IncludePath>).size;
      *pqVar1 = *pqVar1 + 1;
    }
    else {
      local_98.sourceCopyConstruct = 0;
      local_98.nSource = 0;
      local_98.move = 0;
      local_98.sourceCopyAssign = 0;
      local_98.end = (IncludePath *)0x0;
      local_98.last = (IncludePath *)0x0;
      local_98.where = (IncludePath *)0x0;
      local_98.begin = (this->super_QArrayDataPointer<Parser::IncludePath>).ptr;
      local_98.size = (this->super_QArrayDataPointer<Parser::IncludePath>).size;
      local_98.data = &this->super_QArrayDataPointer<Parser::IncludePath>;
      Inserter::insertOne(&local_98,i,&local_48);
      (local_98.data)->ptr = local_98.begin;
      (local_98.data)->size = local_98.size;
    }
    if (&(local_48.path.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_48.path.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  else {
    lVar4 = (this->super_QArrayDataPointer<Parser::IncludePath>).size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc !=
        ((long)((long)(this->super_QArrayDataPointer<Parser::IncludePath>).ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 5) +
        lVar4)) {
      pIVar5 = (this->super_QArrayDataPointer<Parser::IncludePath>).ptr;
      pDVar6 = (args->path).d.d;
      (args->path).d.d = (Data *)0x0;
      pIVar5[lVar4].path.d.d = pDVar6;
      pcVar7 = (args->path).d.ptr;
      (args->path).d.ptr = (char *)0x0;
      pIVar5[lVar4].path.d.ptr = pcVar7;
      qVar8 = (args->path).d.size;
      (args->path).d.size = 0;
      pIVar5[lVar4].path.d.size = qVar8;
      pIVar5[lVar4].isFrameworkPath = args->isFrameworkPath;
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((IncludePath *)
          ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QArrayDataPointer<Parser::IncludePath>).ptr)) goto LAB_0011ec5d;
      pIVar5 = (this->super_QArrayDataPointer<Parser::IncludePath>).ptr;
      pDVar6 = (args->path).d.d;
      (args->path).d.d = (Data *)0x0;
      pIVar5[-1].path.d.d = pDVar6;
      pcVar7 = (args->path).d.ptr;
      (args->path).d.ptr = (char *)0x0;
      pIVar5[-1].path.d.ptr = pcVar7;
      qVar8 = (args->path).d.size;
      (args->path).d.size = 0;
      pIVar5[-1].path.d.size = qVar8;
      pIVar5[-1].isFrameworkPath = args->isFrameworkPath;
      ppIVar2 = &(this->super_QArrayDataPointer<Parser::IncludePath>).ptr;
      *ppIVar2 = *ppIVar2 + -1;
    }
    pqVar1 = &(this->super_QArrayDataPointer<Parser::IncludePath>).size;
    *pqVar1 = *pqVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }